

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source_location.hpp
# Opt level: O2

void __thiscall toml::source_location::source_location(source_location *this,location *loc)

{
  unsigned_long uVar1;
  size_t sVar2;
  string sStack_38;
  
  detail::location::line_num_abi_cxx11_(&sStack_38,loc);
  uVar1 = std::__cxx11::stoul(&sStack_38,(size_t *)0x0,10);
  std::__cxx11::string::~string((string *)&sStack_38);
  this->line_num_ = (uint_least32_t)uVar1;
  sVar2 = detail::location::before(loc);
  this->column_num_ = (int)sVar2 + 1;
  this->region_size_ = 1;
  std::__cxx11::string::string((string *)&this->file_name_,(string *)&loc->source_name_);
  detail::location::line_abi_cxx11_(&this->line_str_,loc);
  return;
}

Assistant:

explicit source_location(const detail::location& loc)
        : line_num_(static_cast<std::uint_least32_t>(std::stoul(loc.line_num()))),
          column_num_(static_cast<std::uint_least32_t>(loc.before() + 1)),
          region_size_(static_cast<std::uint_least32_t>(loc.size())),
          file_name_(loc.name()),
          line_str_ (loc.line())
    {}